

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_cells_aa.h
# Opt level: O0

void agg::qsort_cells<agg::cell_aa>(cell_aa **start,uint num)

{
  cell_aa *pcVar1;
  int iVar2;
  int x;
  cell_aa **pivot;
  cell_aa **j;
  cell_aa **i;
  cell_aa *pcStack_2b0;
  int len;
  cell_aa **base;
  cell_aa **limit;
  cell_aa ***top;
  cell_aa **stack [80];
  uint num_local;
  cell_aa **start_local;
  
  base = start + num;
  pcStack_2b0 = (cell_aa *)start;
  limit = (cell_aa **)&top;
  stack[0x4f]._4_4_ = num;
  while( true ) {
    while (iVar2 = (int)((long)base - (long)pcStack_2b0 >> 3), pcVar1 = pcStack_2b0, 9 < iVar2) {
      swap_cells<agg::cell_aa*>
                ((cell_aa **)pcStack_2b0,(cell_aa **)(&pcStack_2b0->x + (long)(iVar2 / 2) * 2));
      j = (cell_aa **)&pcStack_2b0->cover;
      pivot = base + -1;
      if ((*pivot)->x < (*j)->x) {
        swap_cells<agg::cell_aa*>(j,pivot);
      }
      if ((*(cell_aa **)pcStack_2b0)->x < (*j)->x) {
        swap_cells<agg::cell_aa*>((cell_aa **)pcStack_2b0,j);
      }
      if ((*pivot)->x < (*(cell_aa **)pcStack_2b0)->x) {
        swap_cells<agg::cell_aa*>((cell_aa **)pcStack_2b0,pivot);
      }
      while( true ) {
        do {
          j = j + 1;
        } while ((*j)->x < (*(cell_aa **)pcStack_2b0)->x);
        do {
          pivot = pivot + -1;
        } while ((*(cell_aa **)pcStack_2b0)->x < (*pivot)->x);
        if (pivot < j) break;
        swap_cells<agg::cell_aa*>(j,pivot);
      }
      swap_cells<agg::cell_aa*>((cell_aa **)pcStack_2b0,pivot);
      if ((long)base - (long)j >> 3 < (long)pivot - (long)pcStack_2b0 >> 3) {
        *limit = pcStack_2b0;
        limit[1] = (cell_aa *)pivot;
        pcStack_2b0 = (cell_aa *)j;
      }
      else {
        *limit = (cell_aa *)j;
        limit[1] = (cell_aa *)base;
        base = pivot;
      }
      limit = limit + 2;
    }
    while (pivot = (cell_aa **)pcVar1, j = (cell_aa **)&((cell_aa *)pivot)->cover, j < base) {
      for (; (pcVar1 = (cell_aa *)j, pivot[1]->x < (*pivot)->x &&
             (swap_cells<agg::cell_aa*>(pivot + 1,pivot), pcVar1 = (cell_aa *)j,
             (cell_aa *)pivot != pcStack_2b0)); pivot = pivot + -1) {
      }
    }
    if (limit <= &top) break;
    pcStack_2b0 = limit[-2];
    base = (cell_aa **)limit[-1];
    limit = limit + -2;
  }
  return;
}

Assistant:

void qsort_cells(Cell** start, unsigned num)
    {
        Cell**  stack[80];
        Cell*** top; 
        Cell**  limit;
        Cell**  base;

        limit = start + num;
        base  = start;
        top   = stack;

        for (;;)
        {
            int len = int(limit - base);

            Cell** i;
            Cell** j;
            Cell** pivot;

            if(len > qsort_threshold)
            {
                // we use base + len/2 as the pivot
                pivot = base + len / 2;
                swap_cells(base, pivot);

                i = base + 1;
                j = limit - 1;

                // now ensure that *i <= *base <= *j 
                if((*j)->x < (*i)->x)
                {
                    swap_cells(i, j);
                }

                if((*base)->x < (*i)->x)
                {
                    swap_cells(base, i);
                }

                if((*j)->x < (*base)->x)
                {
                    swap_cells(base, j);
                }

                for(;;)
                {
                    int x = (*base)->x;
                    do i++; while( (*i)->x < x );
                    do j--; while( x < (*j)->x );

                    if(i > j)
                    {
                        break;
                    }

                    swap_cells(i, j);
                }

                swap_cells(base, j);

                // now, push the largest sub-array
                if(j - base > limit - i)
                {
                    top[0] = base;
                    top[1] = j;
                    base   = i;
                }
                else
                {
                    top[0] = i;
                    top[1] = limit;
                    limit  = j;
                }
                top += 2;
            }
            else
            {
                // the sub-array is small, perform insertion sort
                j = base;
                i = j + 1;

                for(; i < limit; j = i, i++)
                {
                    for(; j[1]->x < (*j)->x; j--)
                    {
                        swap_cells(j + 1, j);
                        if (j == base)
                        {
                            break;
                        }
                    }
                }

                if(top > stack)
                {
                    top  -= 2;
                    base  = top[0];
                    limit = top[1];
                }
                else
                {
                    break;
                }
            }
        }
    }